

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lifo.h
# Opt level: O2

void __thiscall
density::detail::LifoArrayImpl<int,_false>::~LifoArrayImpl(LifoArrayImpl<int,_false> *this)

{
  ThreadLifoAllocator<0>::deallocate(this->m_elements,this->m_size * 4 + 7 & 0xfffffffffffffff8);
  return;
}

Assistant:

~LifoArrayImpl()
            {
                detail::ThreadLifoAllocator<>::deallocate(m_elements, compute_mem_size(m_size));
            }